

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O2

void __thiscall
baryonyx::itm::default_cost_type<float>::make_l2_norm(default_cost_type<float> *this,int n)

{
  float *pfVar1;
  float *pfVar2;
  int i;
  ulong uVar3;
  undefined1 auVar4 [16];
  
  pfVar2 = (this->linear_elements)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
           _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
           super__Head_base<0UL,_float_*,_false>._M_head_impl;
  auVar4 = ZEXT816(0) << 0x40;
  uVar3 = 0;
  while ((uint)n != uVar3) {
    pfVar1 = pfVar2 + uVar3;
    uVar3 = uVar3 + 1;
    auVar4 = vfmadd231ss_fma(auVar4,ZEXT416((uint)*pfVar1),ZEXT416((uint)*pfVar1));
  }
  if ((int)ABS(auVar4._0_4_) - 0x800000U < 0x7f000000) {
    for (uVar3 = 0; (uint)n != uVar3; uVar3 = uVar3 + 1) {
      pfVar2[uVar3] = pfVar2[uVar3] / auVar4._0_4_;
    }
  }
  return;
}

Assistant:

void make_l2_norm(int n)
    {
        Float div = { 0 };

        for (int i = 0; i != n; ++i)
            div += linear_elements[i] * linear_elements[i];

        if (std::isnormal(div))
            for (int i = 0; i != n; ++i)
                linear_elements[i] /= div;
    }